

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean encode_mcu_gather(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var4;
  _func_void_j_compress_ptr *p_Var5;
  int *piVar6;
  jpeg_error_mgr *pjVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar9 = *(uint *)&pjVar2[2].encode_mcu;
    if (uVar9 == 0) {
      for (lVar11 = 0; lVar11 < cinfo->comps_in_scan; lVar11 = lVar11 + 1) {
        *(undefined4 *)((long)&pjVar2[1].encode_mcu + lVar11 * 4 + 4) = 0;
      }
      uVar9 = cinfo->restart_interval;
    }
    *(uint *)&pjVar2[2].encode_mcu = uVar9 - 1;
  }
  for (lVar11 = 0; lVar11 < cinfo->blocks_in_MCU; lVar11 = lVar11 + 1) {
    lVar15 = (long)cinfo->MCU_membership[lVar11];
    paJVar3 = MCU_data[lVar11];
    p_Var4 = (&pjVar2[5].encode_mcu)[cinfo->cur_comp_info[lVar15]->dc_tbl_no];
    p_Var5 = (&pjVar2[6].finish_pass)[cinfo->cur_comp_info[lVar15]->ac_tbl_no];
    iVar16 = cinfo->lim_Se;
    piVar6 = cinfo->natural_order;
    uVar12 = (int)(*paJVar3)[0] - *(int *)((long)&pjVar2[1].encode_mcu + lVar15 * 4 + 4);
    uVar9 = -uVar12;
    if (0 < (int)uVar12) {
      uVar9 = uVar12;
    }
    lVar13 = 0;
    for (; uVar9 != 0; uVar9 = uVar9 >> 1) {
      lVar13 = lVar13 + 1;
    }
    if (0xb < (uint)lVar13) {
      pjVar7 = cinfo->err;
      pjVar7->msg_code = 6;
      (*pjVar7->error_exit)((j_common_ptr)cinfo);
    }
    *(long *)(p_Var4 + lVar13 * 8) = *(long *)(p_Var4 + lVar13 * 8) + 1;
    iVar10 = 0;
    if (iVar16 < 1) {
      iVar16 = 0;
    }
    for (uVar14 = 1; uVar14 != iVar16 + 1; uVar14 = uVar14 + 1) {
      uVar1 = (*paJVar3)[piVar6[uVar14]];
      if (uVar1 == 0) {
        iVar10 = iVar10 + 1;
      }
      else {
        iVar17 = iVar10 * 0x10 + 1;
        for (; 0xf < iVar10; iVar10 = iVar10 + -0x10) {
          *(long *)(p_Var5 + 0x780) = *(long *)(p_Var5 + 0x780) + 1;
          iVar17 = iVar17 + -0x100;
        }
        uVar8 = -uVar1;
        if (0 < (short)uVar1) {
          uVar8 = uVar1;
        }
        uVar9 = 1;
        for (uVar12 = (uint)uVar8; 1 < uVar12; uVar12 = uVar12 >> 1) {
          uVar9 = uVar9 + 1;
          iVar17 = iVar17 + 1;
        }
        if (10 < uVar9) {
          pjVar7 = cinfo->err;
          pjVar7->msg_code = 6;
          (*pjVar7->error_exit)((j_common_ptr)cinfo);
        }
        *(long *)(p_Var5 + (long)iVar17 * 8) = *(long *)(p_Var5 + (long)iVar17 * 8) + 1;
        iVar10 = 0;
      }
    }
    if (0 < iVar10) {
      *(long *)p_Var5 = *(long *)p_Var5 + 1;
    }
    *(int *)((long)&pjVar2[1].encode_mcu + lVar15 * 4 + 4) = (int)(*MCU_data[lVar11])[0];
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_gather (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Take care of restart intervals if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      /* Re-initialize DC predictions to 0 */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++)
	entropy->saved.last_dc_val[ci] = 0;
      /* Update restart state */
      entropy->restarts_to_go = cinfo->restart_interval;
    }
    entropy->restarts_to_go--;
  }

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    htest_one_block(cinfo, MCU_data[blkn][0], entropy->saved.last_dc_val[ci],
		    entropy->dc_count_ptrs[compptr->dc_tbl_no],
		    entropy->ac_count_ptrs[compptr->ac_tbl_no]);
    entropy->saved.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  return TRUE;
}